

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultConverters.cpp
# Opt level: O2

void genericCU8toCF32(void *srcBuff,void *dstBuff,size_t numElems,double scaler)

{
  size_t i;
  long lVar1;
  
  for (lVar1 = 0; numElems * 2 != lVar1; lVar1 = lVar1 + 1) {
    *(float *)((long)dstBuff + lVar1 * 4) =
         (float)((double)((float)(int)(char)(*(char *)((long)srcBuff + lVar1) + -0x80) / 127.0) *
                scaler);
  }
  return;
}

Assistant:

static void genericCU8toCF32(const void *srcBuff, void *dstBuff, const size_t numElems, const double scaler)
{
  const size_t elemDepth = 2;

  auto *src = (uint8_t*)srcBuff;
  auto *dst = (float*)dstBuff;
  for (size_t i = 0; i < numElems*elemDepth; i++)
    {
      dst[i] = SoapySDR::U8toF32(src[i]) * scaler;
    }
}